

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

void linkFiles(string *typeName,uint32_t prevFileLink,uint32_t nextFileLink)

{
  _Ios_Openmode _Var1;
  fpos<__mbstate_t> local_638;
  __cxx11 local_628 [32];
  string local_608 [32];
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560 [32];
  undefined1 local_540 [8];
  fstream nextFile;
  char local_530 [512];
  fpos<__mbstate_t> local_330;
  __cxx11 local_320 [32];
  string local_300 [32];
  string local_2e0 [55];
  allocator local_2a9;
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [32];
  undefined1 local_228 [8];
  fstream prevFile;
  char local_218 [512];
  uint32_t local_18;
  uint32_t local_14;
  uint32_t nextFileLink_local;
  uint32_t prevFileLink_local;
  string *typeName_local;
  
  local_18 = nextFileLink;
  local_14 = prevFileLink;
  _nextFileLink_local = typeName;
  if (prevFileLink != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,"data/",&local_2a9);
    std::__cxx11::string::string(local_300,(string *)typeName);
    truncateName(local_2e0);
    std::operator+(local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    std::operator+(local_268,(char *)local_288);
    std::__cxx11::to_string(local_320,local_14);
    std::operator+(local_248,local_268);
    _Var1 = std::operator|(_S_in,_S_out);
    _Var1 = std::operator|(_Var1,_S_bin);
    std::fstream::fstream(local_228,(string *)local_248,_Var1);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    std::fpos<__mbstate_t>::fpos(&local_330,0x12);
    std::ostream::seekp(local_218,local_330._M_off,local_330._M_state);
    std::ostream::write(local_218,(long)&local_18);
    std::fstream::close();
    std::fstream::~fstream(local_228);
  }
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"data/",&local_5c1);
    std::__cxx11::string::string(local_608,(string *)typeName);
    truncateName(local_5e8);
    std::operator+(local_5a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0);
    std::operator+(local_580,(char *)local_5a0);
    std::__cxx11::to_string(local_628,local_18);
    std::operator+(local_560,local_580);
    _Var1 = std::operator|(_S_in,_S_out);
    _Var1 = std::operator|(_Var1,_S_bin);
    std::fstream::fstream(local_540,(string *)local_560,_Var1);
    std::__cxx11::string::~string((string *)local_560);
    std::__cxx11::string::~string((string *)local_628);
    std::__cxx11::string::~string((string *)local_580);
    std::__cxx11::string::~string((string *)local_5a0);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::string::~string(local_608);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::fpos<__mbstate_t>::fpos(&local_638,0xe);
    std::ostream::seekp(local_530,local_638._M_off,local_638._M_state);
    std::ostream::write(local_530,(long)&local_14);
    std::fstream::close();
    std::fstream::~fstream(local_540);
  }
  return;
}

Assistant:

void linkFiles(const string typeName, uint32_t prevFileLink, uint32_t nextFileLink) {
    if (prevFileLink != 0) {
        fstream prevFile(ROOT + truncateName(typeName) + INFIX + to_string(prevFileLink), INOUTBIN);

        prevFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE);
        prevFile.write((char *) &nextFileLink, LINK_TO_FILE);

        prevFile.close();
    }

    if (nextFileLink != 0) {
        fstream nextFile(ROOT + truncateName(typeName) + INFIX + to_string(nextFileLink), INOUTBIN);

        nextFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS);
        nextFile.write((char *) &prevFileLink, LINK_TO_FILE);

        nextFile.close();
    }
}